

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

string * __thiscall
r_comp::Compiler::getError_abi_cxx11_(string *__return_storage_ptr__,Compiler *this)

{
  undefined8 *puVar1;
  uint uVar2;
  pointer pcVar3;
  uint __val;
  long lVar4;
  uint uVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint uVar8;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_b0 = local_a0;
  pcVar3 = (this->m_errorFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + (this->m_errorFile)._M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  uVar2 = this->m_errorLine;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_00124738;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_00124738;
      }
      if (uVar8 < 10000) goto LAB_00124738;
      uVar11 = uVar11 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_00124738:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_70),__len,__val);
  uVar11 = 0xf;
  if (local_b0 != local_a0) {
    uVar11 = local_a0[0];
  }
  if (uVar11 < (ulong)(local_68 + local_a8)) {
    uVar11 = 0xf;
    if (local_70 != local_60) {
      uVar11 = local_60[0];
    }
    if ((ulong)(local_68 + local_a8) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
      goto LAB_001247cb;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70);
LAB_001247cb:
  local_90 = &local_80;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar6[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar6;
  }
  local_88 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_40 = *plVar9;
    lStack_38 = plVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar9;
    local_50 = (long *)*plVar7;
  }
  local_48 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)(this->error)._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    lVar4 = plVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Compiler::getError()
{
    return m_errorFile + ":" + std::to_string(m_errorLine) + ": " + error;
}